

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  Queue<unsigned_int> *this_01;
  int iVar1;
  int iVar2;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *this_02;
  vec<unsigned_int,_int> *pvVar3;
  uint *puVar4;
  int iVar5;
  long lVar6;
  int j;
  long lVar7;
  CRef cr;
  Ref local_40;
  int local_3c;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *local_38;
  
  if (this->use_simplification == true) {
    local_38 = &this->occurs;
    this_00 = &(this->super_Solver).ca;
    for (local_3c = 0; this_02 = local_38, local_3c < (this->super_Solver).next_var;
        local_3c = local_3c + 1) {
      OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
      ::clean(local_38,&local_3c);
      pvVar3 = IntMap<int,_Minisat::vec<unsigned_int,_int>,_Minisat::MkIndexDefault<int>_>::
               operator[](&this_02->occs,local_3c);
      lVar6 = 0;
      for (lVar7 = 0; lVar7 < pvVar3->sz; lVar7 = lVar7 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)pvVar3->data + lVar6),to);
        lVar6 = lVar6 + 4;
      }
    }
    iVar1 = (this->subsumption_queue).end;
    iVar5 = 0;
    iVar2 = (this->subsumption_queue).first;
    if (iVar1 < iVar2) {
      iVar5 = (this->subsumption_queue).buf.sz;
    }
    this_01 = &this->subsumption_queue;
    for (iVar5 = (iVar1 - iVar2) + iVar5; 0 < iVar5; iVar5 = iVar5 + -1) {
      local_40 = Queue<unsigned_int>::peek(this_01);
      Queue<unsigned_int>::pop(this_01);
      puVar4 = RegionAllocator<unsigned_int>::operator[](&this_00->ra,local_40);
      if ((*puVar4 & 3) == 0) {
        ClauseAllocator::reloc(this_00,&local_40,to);
        Queue<unsigned_int>::insert(this_01,local_40);
      }
    }
    ClauseAllocator::reloc(this_00,&this->bwdsub_tmpunit,to);
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (int i = 0; i < nVars(); i++){
        occurs.clean(i);
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (int i = subsumption_queue.size(); i > 0; i--){
        CRef cr = subsumption_queue.peek(); subsumption_queue.pop();
        if (ca[cr].mark()) continue;
        ca.reloc(cr, to);
        subsumption_queue.insert(cr);
    }
        
    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}